

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_h_predictor_8x4_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  __m128i left_u16;
  int bd_local;
  uint16_t *left_local;
  uint16_t *above_local;
  ptrdiff_t stride_local;
  uint16_t *dst_local;
  
  auVar2 = pshuflw(*(undefined1 (*) [16])left,*(undefined1 (*) [16])left,0);
  auVar3 = pshuflw(*(undefined1 (*) [16])left,*(undefined1 (*) [16])left,0x55);
  auVar4 = pshuflw(*(undefined1 (*) [16])left,*(undefined1 (*) [16])left,0xaa);
  auVar5 = pshuflw(*(undefined1 (*) [16])left,*(undefined1 (*) [16])left,0xff);
  local_158 = auVar2._0_8_;
  *(undefined8 *)dst = local_158;
  *(undefined8 *)(dst + 4) = local_158;
  puVar1 = dst + stride;
  local_168 = auVar3._0_8_;
  *(undefined8 *)puVar1 = local_168;
  *(undefined8 *)(puVar1 + 4) = local_168;
  puVar1 = puVar1 + stride;
  local_178 = auVar4._0_8_;
  *(undefined8 *)puVar1 = local_178;
  *(undefined8 *)(puVar1 + 4) = local_178;
  local_188 = auVar5._0_8_;
  *(undefined8 *)(puVar1 + stride) = local_188;
  *(undefined8 *)(puVar1 + stride + 4) = local_188;
  return;
}

Assistant:

void aom_highbd_h_predictor_8x4_sse2(uint16_t *dst, ptrdiff_t stride,
                                     const uint16_t *above,
                                     const uint16_t *left, int bd) {
  const __m128i left_u16 = _mm_load_si128((const __m128i *)left);
  const __m128i row0 = _mm_shufflelo_epi16(left_u16, 0x0);
  const __m128i row1 = _mm_shufflelo_epi16(left_u16, 0x55);
  const __m128i row2 = _mm_shufflelo_epi16(left_u16, 0xaa);
  const __m128i row3 = _mm_shufflelo_epi16(left_u16, 0xff);
  (void)above;
  (void)bd;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row0, row0));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row1, row1));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row2, row2));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row3, row3));
}